

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O0

OP1aHeader * __thiscall ASDCP::MXF::OP1aHeader::InitFromFile(OP1aHeader *this,IFileReader *Reader)

{
  bool bVar1;
  int iVar2;
  ui32_t uVar3;
  ui32_t uVar4;
  Dictionary *pDVar5;
  MDDEntry *pMVar6;
  Dictionary *pDVar7;
  ILogSink *pIVar8;
  byte_t *pbVar9;
  long *in_RDX;
  Result_t local_228 [108];
  undefined4 local_1bc;
  Result_t local_1b8 [108];
  ui32_t local_14c;
  Result_t local_148 [4];
  ui32_t read_count;
  undefined4 local_dc;
  UL local_d8;
  UL local_b8;
  undefined4 local_98;
  undefined1 local_88 [8];
  Result_t result;
  IFileReader *Reader_local;
  OP1aHeader *this_local;
  
  Partition::InitFromFile((Partition *)local_88,Reader);
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_88);
  if (iVar2 < 0) {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)local_88);
  }
  else {
    pDVar7 = *(Dictionary **)(Reader + 0x78);
    pDVar5 = DefaultCompositeDict();
    if (pDVar7 == pDVar5) {
      pMVar6 = MXFInterop_OPAtom_Entry();
      UL::UL(&local_b8,pMVar6->ul);
      bVar1 = UL::MatchExact((UL *)(Reader + 200),&local_b8);
      UL::~UL(&local_b8);
      if (bVar1) {
        pDVar7 = DefaultInteropDict();
        *(Dictionary **)(Reader + 0x78) = pDVar7;
      }
      else {
        pMVar6 = SMPTE_390_OPAtom_Entry();
        UL::UL(&local_d8,pMVar6->ul);
        bVar1 = UL::MatchExact((UL *)(Reader + 200),&local_d8);
        UL::~UL(&local_d8);
        if (bVar1) {
          pDVar7 = DefaultSMPTEDict();
          *(Dictionary **)(Reader + 0x78) = pDVar7;
        }
      }
    }
    if (*(long *)(Reader + 0xa0) == 0) {
      pIVar8 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Warn(pIVar8,"MXF file contents incomplete.\n");
      local_dc = 0x319;
      Kumu::Result_t::operator()((int *)this,ASDCP::RESULT_KLV_CODING);
    }
    else {
      if (*(ulong *)(Reader + 0xa0) < 0x400) {
        pIVar8 = (ILogSink *)Kumu::DefaultLogSink();
        Kumu::ILogSink::Warn
                  (pIVar8,"Improbably small HeaderByteCount value: %qu\n",
                   *(undefined8 *)(Reader + 0xa0));
      }
      else if (0x400000 < *(ulong *)(Reader + 0xa0)) {
        pIVar8 = (ILogSink *)Kumu::DefaultLogSink();
        Kumu::ILogSink::Warn
                  (pIVar8,"Improbably huge HeaderByteCount value: %qu\n",
                   *(undefined8 *)(Reader + 0xa0));
      }
      Kumu::xmin<unsigned_int>(0x400000,*(uint *)(Reader + 0xa0));
      Kumu::ByteString::Capacity((uint)local_148);
      Kumu::Result_t::operator=((Result_t *)local_88,local_148);
      Kumu::Result_t::~Result_t(local_148);
      iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_88);
      if (-1 < iVar2) {
        pbVar9 = Kumu::ByteString::Data((ByteString *)(Reader + 0x128));
        uVar3 = Kumu::ByteString::Capacity((ByteString *)(Reader + 0x128));
        (**(code **)(*in_RDX + 0x38))(local_1b8,in_RDX,pbVar9,uVar3,&local_14c);
        Kumu::Result_t::operator=((Result_t *)local_88,local_1b8);
        Kumu::Result_t::~Result_t(local_1b8);
        iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_88);
        uVar3 = local_14c;
        if (iVar2 < 0) {
          pIVar8 = (ILogSink *)Kumu::DefaultLogSink();
          Kumu::ILogSink::Error(pIVar8,"OP1aHeader::InitFromFile, read failed.\n");
          Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)local_88);
          goto LAB_0023b7e6;
        }
        uVar4 = Kumu::ByteString::Capacity((ByteString *)(Reader + 0x128));
        if (uVar3 != uVar4) {
          pIVar8 = (ILogSink *)Kumu::DefaultLogSink();
          uVar3 = Kumu::ByteString::Capacity((ByteString *)(Reader + 0x128));
          Kumu::ILogSink::Error
                    (pIVar8,"Short read of OP-Atom header metadata; wanted %u, got %u.\n",
                     (ulong)uVar3,(ulong)local_14c);
          local_1bc = 0x335;
          Kumu::Result_t::operator()((int *)this,ASDCP::RESULT_KLV_CODING);
          goto LAB_0023b7e6;
        }
      }
      iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_88);
      if (-1 < iVar2) {
        pbVar9 = Kumu::ByteString::RoData((ByteString *)(Reader + 0x128));
        uVar3 = Kumu::ByteString::Capacity((ByteString *)(Reader + 0x128));
        (**(code **)(*(long *)Reader + 0x28))(local_228,Reader,pbVar9,uVar3);
        Kumu::Result_t::operator=((Result_t *)local_88,local_228);
        Kumu::Result_t::~Result_t(local_228);
      }
      Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)local_88);
    }
  }
LAB_0023b7e6:
  local_98 = 1;
  Kumu::Result_t::~Result_t((Result_t *)local_88);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::OP1aHeader::InitFromFile(const Kumu::IFileReader& Reader)
{
  Result_t result = Partition::InitFromFile(Reader);

  if ( ASDCP_FAILURE(result) )
    return result;

  if ( m_Dict == &DefaultCompositeDict() )
    {
      // select more explicit dictionary if one is available
      if ( OperationalPattern.MatchExact(MXFInterop_OPAtom_Entry().ul) )
	{
	  m_Dict = &DefaultInteropDict();
	}
      else if ( OperationalPattern.MatchExact(SMPTE_390_OPAtom_Entry().ul) )
	{
	  m_Dict = &DefaultSMPTEDict();
	}
    }

  // slurp up the remainder of the header
  if ( HeaderByteCount == 0 )
    {
      DefaultLogSink().Warn("MXF file contents incomplete.\n");
      return RESULT_KLV_CODING(__LINE__, __FILE__);
    }
  else if ( HeaderByteCount < 1024 )
    {
      DefaultLogSink().Warn("Improbably small HeaderByteCount value: %qu\n", HeaderByteCount);
    }
  else if (HeaderByteCount > ( 4 * Kumu::Megabyte ) )
    {
      DefaultLogSink().Warn("Improbably huge HeaderByteCount value: %qu\n", HeaderByteCount);
    }
  
  result = m_HeaderData.Capacity(Kumu::xmin(4*Kumu::Megabyte, static_cast<ui32_t>(HeaderByteCount)));

  if ( ASDCP_SUCCESS(result) )
    {
      ui32_t read_count;
      result = Reader.Read(m_HeaderData.Data(), m_HeaderData.Capacity(), &read_count);

      if ( ASDCP_FAILURE(result) )
        {
	  DefaultLogSink().Error("OP1aHeader::InitFromFile, read failed.\n");
	  return result;
        }

      if ( read_count != m_HeaderData.Capacity() )
	{
	  DefaultLogSink().Error("Short read of OP-Atom header metadata; wanted %u, got %u.\n",
				 m_HeaderData.Capacity(), read_count);
	  return RESULT_KLV_CODING(__LINE__, __FILE__);
	}
    }

  if ( ASDCP_SUCCESS(result) )
    result = InitFromBuffer(m_HeaderData.RoData(), m_HeaderData.Capacity());

  return result;
}